

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O3

void __thiscall cppnet::RWSocket::OnDisConnect(RWSocket *this,uint16_t err)

{
  uint64_t *puVar1;
  int iVar2;
  CppNetBase *this_00;
  element_type *peVar3;
  int iVar4;
  _Atomic_word _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long *in_FS_OFFSET;
  bool bVar7;
  shared_ptr<cppnet::RWSocket> sock;
  shared_ptr<cppnet::RWSocket> local_40;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::RWSocket,void>
            ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppnet::RWSocket>);
  Socket::__all_socket_map::__tls_init();
  puVar1 = &(this->super_Socket)._sock;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(*in_FS_OFFSET + -0x40),puVar1);
  iVar4 = (*(this->super_Socket)._vptr_Socket[0x15])(this);
  if (((char)iVar4 == '\0') &&
     (p_Var6 = (this->super_Socket)._cppnet_base.
               super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
     p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    _Var5 = p_Var6->_M_use_count;
    do {
      if (_Var5 == 0) goto LAB_0010d2ba;
      LOCK();
      iVar4 = p_Var6->_M_use_count;
      bVar7 = _Var5 == iVar4;
      if (bVar7) {
        p_Var6->_M_use_count = _Var5 + 1;
        iVar4 = _Var5;
      }
      _Var5 = iVar4;
      UNLOCK();
    } while (!bVar7);
    this_00 = (this->super_Socket)._cppnet_base.
              super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (CppNetBase *)0x0 && p_Var6->_M_use_count != 0) {
      local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_30;
      local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_28;
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_28->_M_use_count = local_28->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_28->_M_use_count = local_28->_M_use_count + 1;
        }
      }
      CppNetBase::OnDisConnect(this_00,&local_40,err);
      if (local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
LAB_0010d2ba:
  (*(this->super_Socket)._vptr_Socket[0x14])(this);
  if ((err != 0) && (this->_event != (Event *)0x0)) {
    p_Var6 = (this->super_Socket)._event_actions.
             super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010d31a:
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      iVar4 = p_Var6->_M_use_count;
      do {
        if (iVar4 == 0) goto LAB_0010d31a;
        LOCK();
        iVar2 = p_Var6->_M_use_count;
        bVar7 = iVar4 == iVar2;
        if (bVar7) {
          p_Var6->_M_use_count = iVar4 + 1;
          iVar2 = iVar4;
        }
        iVar4 = iVar2;
        UNLOCK();
      } while (!bVar7);
      peVar3 = (this->super_Socket)._event_actions.
               super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 != (element_type *)0x0 && p_Var6->_M_use_count != 0) {
        (*peVar3->_vptr_EventActions[9])(peVar3,this->_event);
      }
    }
    OsHandle::Close(*puVar1);
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void RWSocket::OnDisConnect(uint16_t err) {
    auto sock = shared_from_this();
    __all_socket_map.erase(_sock);

    if (!IsShutdown()) {
        auto cppnet_base = _cppnet_base.lock();
        if (cppnet_base) {
            cppnet_base->OnDisConnect(sock, err);
        }
    }
    SetShutdown();

    // peer disconnect or connection break.
    if (_event && err != CEC_SUCCESS) {
        auto actions = GetEventActions();
        if (actions) {
            actions->DelEvent(_event);
        }
        OsHandle::Close(_sock);
    }
}